

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  char *key;
  ArrayIndex AVar2;
  PathArgument *arg;
  pointer pPVar3;
  Value *other;
  
  pPVar3 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  other = root;
  if (pPVar3 != (this->args_).
                super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (pPVar3->kind_ == kindKey) {
        other = defaultValue;
        if (((root->field_0x8 != '\a') ||
            (key = (pPVar3->key_)._M_dataplus._M_p,
            root = Value::find(root,key,key + (pPVar3->key_)._M_string_length), other = defaultValue
            , root == (Value *)0x0)) || (other = defaultValue, root == (Value *)kNull)) break;
      }
      else if (pPVar3->kind_ == kindIndex) {
        other = defaultValue;
        if ((root->field_0x8 != '\x06') ||
           (uVar1 = pPVar3->index_, AVar2 = Value::size(root), other = defaultValue, AVar2 <= uVar1)
           ) break;
        root = Value::operator[](root,pPVar3->index_);
      }
      pPVar3 = pPVar3 + 1;
      other = root;
    } while (pPVar3 != (this->args_).
                       super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  Value::Value(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullRef)
        return defaultValue;
    }
  }
  return *node;
}